

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_must(lysc_ctx *ctx,lysp_restr *must_p,lysc_must *must)

{
  void **ppvVar1;
  ly_ctx *ctx_00;
  char *__s;
  lysc_ext_instance *plVar2;
  lysp_ext_instance *plVar3;
  bool bVar4;
  LY_ERR LVar5;
  size_t value_len;
  long *plVar6;
  lysp_ext_instance *plVar7;
  lysp_ext_instance *plVar8;
  void *pvVar9;
  long lVar10;
  LY_VALUE_FORMAT format;
  LY_VALUE_FORMAT local_34;
  
  LVar5 = lyxp_expr_parse(ctx->ctx,(must_p->arg).str,0,'\x01',&must->cond);
  if (LVar5 == LY_SUCCESS) {
    ctx_00 = ctx->ctx;
    __s = (must_p->arg).str;
    value_len = strlen(__s);
    LVar5 = lyplg_type_prefix_data_new
                      (ctx_00,__s,value_len,LY_VALUE_SCHEMA,(must_p->arg).mod,&local_34,
                       &must->prefixes);
    if ((((LVar5 == LY_SUCCESS) &&
         (LVar5 = lydict_dup(ctx->ctx,must_p->eapptag,&must->eapptag), LVar5 == LY_SUCCESS)) &&
        (LVar5 = lydict_dup(ctx->ctx,must_p->emsg,&must->emsg), LVar5 == LY_SUCCESS)) &&
       ((LVar5 = lydict_dup(ctx->ctx,must_p->dsc,&must->dsc), LVar5 == LY_SUCCESS &&
        (LVar5 = lydict_dup(ctx->ctx,must_p->ref,&must->ref), LVar5 == LY_SUCCESS)))) {
      plVar7 = must_p->exts;
      if (plVar7 == (lysp_ext_instance *)0x0) {
        LVar5 = LY_SUCCESS;
      }
      else {
        plVar2 = must->exts;
        if (plVar2 == (lysc_ext_instance *)0x0) {
          pvVar9 = (void *)0x0;
          plVar6 = (long *)calloc(1,(long)plVar7[-1].exts * 0x48 + 8);
        }
        else {
          pvVar9 = plVar2[-1].compiled;
          plVar6 = (long *)realloc(&plVar2[-1].compiled,
                                   ((long)&(plVar7[-1].exts)->name +
                                   (long)plVar2[-1].compiled + (long)pvVar9) * 0x48 + 8);
        }
        if (plVar6 == (long *)0x0) {
          bVar4 = false;
          LVar5 = LY_EMEM;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_must");
        }
        else {
          must->exts = (lysc_ext_instance *)(plVar6 + 1);
          if (must_p->exts == (lysp_ext_instance *)0x0) {
            plVar7 = (lysp_ext_instance *)0x0;
          }
          else {
            plVar7 = must_p->exts[-1].exts;
          }
          LVar5 = LY_SUCCESS;
          memset(plVar6 + *plVar6 * 9 + 1,0,((long)&plVar7->name + (long)pvVar9) * 0x48);
          bVar4 = true;
        }
        if (bVar4) {
          lVar10 = 0;
          plVar7 = (lysp_ext_instance *)0x0;
          while( true ) {
            plVar3 = must_p->exts;
            if (plVar3 == (lysp_ext_instance *)0x0) {
              plVar8 = (lysp_ext_instance *)0x0;
            }
            else {
              plVar8 = plVar3[-1].exts;
            }
            if (plVar8 <= plVar7) break;
            plVar2 = must->exts;
            pvVar9 = plVar2[-1].compiled;
            plVar2[-1].compiled = (void *)((long)pvVar9 + 1);
            LVar5 = lys_compile_ext(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar10),
                                    plVar2 + (-(ulong)(plVar2 == (lysc_ext_instance *)0x0) |
                                             (ulong)pvVar9),must);
            if (LVar5 != LY_SUCCESS) {
              if (LVar5 != LY_ENOT) {
                return LVar5;
              }
              ppvVar1 = &must->exts[-1].compiled;
              *ppvVar1 = (void *)((long)*ppvVar1 + -1);
            }
            plVar7 = (lysp_ext_instance *)((long)&plVar7->name + 1);
            lVar10 = lVar10 + 0x70;
            LVar5 = LY_SUCCESS;
          }
          return LVar5;
        }
      }
    }
  }
  return LVar5;
}

Assistant:

LY_ERR
lys_compile_must(struct lysc_ctx *ctx, const struct lysp_restr *must_p, struct lysc_must *must)
{
    LY_ERR ret = LY_SUCCESS;
    LY_VALUE_FORMAT format;

    LY_CHECK_RET(lyxp_expr_parse(ctx->ctx, must_p->arg.str, 0, 1, &must->cond));
    LY_CHECK_RET(lyplg_type_prefix_data_new(ctx->ctx, must_p->arg.str, strlen(must_p->arg.str),
            LY_VALUE_SCHEMA, must_p->arg.mod, &format, (void **)&must->prefixes));
    DUP_STRING_GOTO(ctx->ctx, must_p->eapptag, must->eapptag, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->emsg, must->emsg, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->dsc, must->dsc, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->ref, must->ref, ret, done);
    COMPILE_EXTS_GOTO(ctx, must_p->exts, must->exts, must, ret, done);

done:
    return ret;
}